

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode
          (FileGenerator *this,Printer *p)

{
  FileGenerator *pFVar1;
  ctrl_t *pcVar2;
  MessageFactory MVar3;
  btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
  bVar4;
  pointer puVar5;
  DescriptorPool *pDVar6;
  vector *pvVar7;
  MessageFactory *pMVar8;
  size_type sVar9;
  undefined8 uVar10;
  bool bVar11;
  char cVar12;
  FileOptions_OptimizeMode FVar13;
  ServiceDescriptor *this_00;
  mapped_type pDVar14;
  mapped_type *ppDVar15;
  Arena *pAVar16;
  string *psVar17;
  reference ppVar18;
  Message *extraout_RDX;
  int iVar19;
  int iVar20;
  char *pcVar21;
  size_t sVar22;
  long lVar23;
  int i;
  FileDescriptor *pFVar24;
  pointer puVar25;
  Message *pMVar26;
  _Alloc_hider _Var27;
  initializer_list<const_google::protobuf::Message_*> __l;
  const_iterator other;
  iterator iVar28;
  string_view filename;
  string_view filename_00;
  string_view name;
  string_view name_00;
  btree_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  res;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  size_t num_deps;
  string file_data;
  string desc_name;
  DynamicMessageFactory factory;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  to_process;
  CrossFileReferences refs;
  FileDescriptorProto file_proto;
  Options *in_stack_fffffffffffff6a8;
  Message *pMVar29;
  Options *pOVar30;
  Options *local_948;
  Options *local_940;
  string local_938;
  Message *local_918;
  undefined1 local_910 [16];
  undefined1 local_900 [32];
  char *pcStack_8e0;
  Message local_8d8 [40];
  _Alloc_hider local_8b0;
  FileGenerator *local_8a8;
  undefined1 local_8a0 [16];
  _Alloc_hider _Stack_890;
  HeapOrSoo local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  FileDescriptor *local_848;
  pointer local_840;
  FileDescriptor local_838 [8];
  undefined8 uStack_830;
  FileDescriptor *local_828;
  pointer local_820;
  FileDescriptor local_818;
  undefined7 uStack_817;
  undefined8 uStack_810;
  char *local_808;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_800;
  FileGenerator *local_7e8;
  FileGenerator *local_7e0;
  undefined1 local_7d8 [16];
  HeapOrSoo local_7c8;
  ctrl_t local_7b8;
  undefined7 uStack_7b7;
  pointer pAStack_7b0;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  undefined1 local_668 [32];
  string local_648;
  undefined1 local_628 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  anon_class_1_0_00000001 local_608 [8];
  undefined1 auStack_600 [8];
  undefined1 local_5f8 [56];
  char acStack_5c0 [8];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [32];
  code *local_588;
  code *local_580;
  HeapOrSoo local_578;
  pointer local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  undefined1 local_550;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_548;
  undefined1 local_500 [32];
  undefined1 local_4e0 [24];
  code *local_4c8;
  bool local_4c0;
  _Alloc_hider local_4b8;
  size_t local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  bool local_498;
  bool local_450;
  Sub local_448;
  Sub local_390;
  Sub local_2d8;
  Sub local_220;
  CrossFileReferences local_160;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_118 [9];
  
  local_948 = (Options *)p;
  if ((this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    google::protobuf::io::Printer::Emit
              (p,0,0,0x6d,
               "\n      static constexpr const ::_pb::EnumDescriptor**\n          $file_level_enum_descriptors$ = nullptr;\n    "
              );
  }
  else {
    local_628._0_8_ = local_628 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"len","");
    local_118[0].
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)(this->enum_generators_).
                         super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->enum_generators_).
                         super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    io::Printer::Sub::Sub<unsigned_long>
              ((Sub *)local_5b8,(string *)local_628,(unsigned_long *)local_118);
    google::protobuf::io::Printer::Emit
              (p,local_5b8,1,0x55,
               "\n      static const ::_pb::EnumDescriptor* $file_level_enum_descriptors$[$len$];\n    "
              );
    if (local_548._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_548);
    }
    if (local_578.heap.slot_array.p != (MaybeInitializedPtr)&local_560) {
      operator_delete((void *)local_578.heap.slot_array,
                      CONCAT71(local_560._M_allocated_capacity._1_7_,local_560._M_local_buf[0]) + 1)
      ;
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_578.soo_data[0]]._M_data)
              ((anon_class_1_0_00000001 *)&local_160,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_5a8 + 0x10));
    local_578.soo_data[0] = 0xff;
    if ((FileGenerator *)local_5b8._0_8_ != (FileGenerator *)local_5a8) {
      operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
    }
    if ((undefined1 *)local_628._0_8_ != local_628 + 0x10) {
      operator_delete((void *)local_628._0_8_,local_618._M_allocated_capacity + 1);
    }
  }
  pFVar24 = this->file_;
  local_940 = &this->options_;
  if ((((*(int *)(pFVar24 + 0x44) < 1) ||
       (FVar13 = GetOptimizeFor(pFVar24,local_940,(bool *)0x0), pOVar30 = local_948,
       FVar13 == FileOptions_OptimizeMode_LITE_RUNTIME)) ||
      (*(char *)(*(long *)(pFVar24 + 0x80) + 0xa3) != '\x01')) || (*(int *)(this->file_ + 0x44) < 1)
     ) {
    google::protobuf::io::Printer::Emit
              (local_948,0,0,0x73,
               "\n      static constexpr const ::_pb::ServiceDescriptor**\n          $file_level_service_descriptors$ = nullptr;\n    "
              );
  }
  else {
    local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"len","");
    local_118[0].
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_118[0].
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)(this->file_ + 0x44));
    io::Printer::Sub::Sub<int>((Sub *)local_5b8,&local_648,(int *)local_118);
    google::protobuf::io::Printer::Emit
              (pOVar30,local_5b8,1,0x65,
               "\n      static const ::_pb::ServiceDescriptor*\n          $file_level_service_descriptors$[$len$];\n    "
              );
    if (local_548._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_548);
    }
    if (local_578.heap.slot_array.p != (MaybeInitializedPtr)&local_560) {
      operator_delete((void *)local_578.heap.slot_array,
                      CONCAT71(local_560._M_allocated_capacity._1_7_,local_560._M_local_buf[0]) + 1)
      ;
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_578.soo_data[0]]._M_data)
              ((anon_class_1_0_00000001 *)&local_160,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_5a8 + 0x10));
    local_578.soo_data[0] = 0xff;
    if ((FileGenerator *)local_5b8._0_8_ != (FileGenerator *)local_5a8) {
      operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_dataplus._M_p != &local_648.field_2) {
      operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
    }
  }
  puVar25 = (this->message_generators_).
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar25 == puVar5) {
    google::protobuf::io::Printer::Emit
              (local_948,0,0,0xcd,
               "\n      const ::uint32_t $tablename$::offsets[1] = {};\n      static constexpr ::_pbi::MigrationSchema* schemas = nullptr;\n      static constexpr ::_pb::Message* const* file_default_instances = nullptr;\n    "
              );
  }
  else {
    local_118[0].
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118[0].
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118[0].
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve(local_118,(long)puVar5 - (long)puVar25 >> 3);
    pOVar30 = local_948;
    pFVar1 = (FileGenerator *)(local_8a0 + 8);
    local_8a8 = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"offsets","");
    local_5b8._0_8_ = local_5a8;
    if (local_8a8 == pFVar1) {
      local_5a8._8_8_ = _Stack_890._M_p;
    }
    else {
      local_5b8._0_8_ = local_8a8;
    }
    local_5a8._1_7_ = local_8a0._9_7_;
    local_5a8[0] = local_8a0[8];
    local_5b8._8_8_ = local_8a0._0_8_;
    local_8a0._0_8_ = (FileGenerator *)0x0;
    local_8a0[8] = '\0';
    local_8a8 = pFVar1;
    local_5a8._16_8_ = operator_new(0x20);
    *(FileGenerator **)local_5a8._16_8_ = this;
    *(vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      **)(local_5a8._16_8_ + 8) = local_118;
    *(Options ***)(local_5a8._16_8_ + 0x10) = &local_948;
    *(undefined1 *)(local_5a8._16_8_ + 0x18) = 0;
    local_580 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_5a8._24_8_ = 0;
    local_588 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_578.soo_data[0] = 1;
    local_578.heap.slot_array = (MaybeInitializedPtr)&local_560;
    local_568 = (pointer)0x0;
    local_560._M_local_buf[0] = '\0';
    local_550 = false;
    std::__cxx11::string::_M_replace((long)&local_578 + 8,0,(char *)0x0,0x36a4ec);
    local_548._M_engaged = false;
    pcVar2 = local_7d8 + 0x20;
    local_7c8.heap.control = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_7d8 + 0x10),"schemas","");
    local_500._0_8_ = local_500 + 0x10;
    if (local_7c8.heap.control == pcVar2) {
      local_500._24_8_ = pAStack_7b0;
    }
    else {
      local_500._0_8_ = local_7c8.heap.control;
    }
    local_500._8_8_ = local_7c8.heap.slot_array;
    local_7c8.heap.slot_array.p = (MaybeInitializedPtr)0x0;
    local_7b8 = '\0';
    local_7c8.heap.control = pcVar2;
    local_4e0._0_8_ = operator_new(0x20);
    *(FileGenerator **)local_4e0._0_8_ = this;
    *(Options ***)(local_4e0._0_8_ + 8) = &local_948;
    *(vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      **)(local_4e0._0_8_ + 0x10) = local_118;
    *(char *)(local_4e0._0_8_ + 0x18) = '\0';
    local_4c8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_4e0._8_8_ = 0;
    local_4e0._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_4c0 = true;
    local_4b8._M_p = (pointer)&local_4a8;
    local_4b0 = 0;
    local_4a8._M_local_buf[0] = '\0';
    local_498 = false;
    std::__cxx11::string::_M_replace((ulong)&local_4b8,0,(char *)0x0,0x36a4ec);
    local_450 = false;
    google::protobuf::io::Printer::Emit
              (pOVar30,local_5b8,2,0x160,
               "\n          const ::uint32_t\n              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n                  protodesc_cold) = {\n                  $offsets$,\n          };\n\n          static const ::_pbi::MigrationSchema\n              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {\n                  $schemas$,\n          };\n        "
              );
    lVar23 = 0x170;
    do {
      if (acStack_5c0[lVar23] == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (auStack_600 + lVar23));
      }
      if (local_608 + lVar23 + -0x10 != *(anon_class_1_0_00000001 **)(local_628 + lVar23)) {
        operator_delete(*(anon_class_1_0_00000001 **)(local_628 + lVar23),
                        *(long *)(local_608 + lVar23 + -0x10) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)local_648.field_2._M_local_buf[lVar23 + 8]]._M_data)
                ((anon_class_1_0_00000001 *)&local_160,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_668 + lVar23 + 0x18));
      local_648.field_2._M_local_buf[lVar23 + 8] = -1;
      if ((long *)(local_668 + lVar23 + 8) != *(long **)(local_668 + lVar23 + -8)) {
        operator_delete(*(long **)(local_668 + lVar23 + -8),*(long *)(local_668 + lVar23 + 8) + 1);
      }
      lVar23 = lVar23 + -0xb8;
    } while (lVar23 != 0);
    if (local_7c8.heap.control != pcVar2) {
      operator_delete(local_7c8.heap.control,CONCAT71(uStack_7b7,local_7b8) + 1);
    }
    if (local_8a8 != (FileGenerator *)(local_8a0 + 8)) {
      operator_delete(local_8a8,CONCAT71(local_8a0._9_7_,local_8a0[8]) + 1);
    }
    bVar11 = UsingImplicitWeakDescriptor(this->file_,local_940);
    pOVar30 = local_948;
    if (!bVar11) {
      local_7e8 = (FileGenerator *)local_7d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e8,"defaults","");
      if (local_7e8 == (FileGenerator *)local_7d8) {
        local_5a8._8_8_ = local_7d8._8_8_;
        local_5b8._0_8_ = (FileGenerator *)local_5a8;
      }
      else {
        local_5b8._0_8_ = local_7e8;
      }
      local_5a8._1_7_ = local_7d8._1_7_;
      local_5a8[0] = local_7d8[0];
      local_5b8._8_8_ = local_7e0;
      local_7e0 = (FileGenerator *)0x0;
      local_7d8[0] = 0;
      local_7e8 = (FileGenerator *)local_7d8;
      local_5a8._16_8_ = operator_new(0x18);
      *(FileGenerator **)local_5a8._16_8_ = this;
      *(Options ***)(local_5a8._16_8_ + 8) = &local_948;
      *(undefined1 *)(local_5a8._16_8_ + 0x10) = 0;
      local_580 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_5a8._24_8_ = 0;
      local_588 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_578.soo_data[0] = 1;
      local_578.heap.slot_array = (MaybeInitializedPtr)&local_560;
      local_568 = (pointer)0x0;
      local_560._M_local_buf[0] = '\0';
      local_550 = false;
      std::__cxx11::string::_M_replace((long)&local_578 + 8,0,(char *)0x0,0x36a4ec);
      local_548._M_engaged = false;
      google::protobuf::io::Printer::Emit
                (pOVar30,local_5b8,1,0x92,
                 "\n                static const ::_pb::Message* const file_default_instances[] = {\n                    $defaults$,\n                };\n              "
                );
      if (local_548._M_engaged == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  (&local_548);
      }
      if (local_578.heap.slot_array.p != (MaybeInitializedPtr)&local_560) {
        operator_delete((void *)local_578.heap.slot_array,
                        CONCAT71(local_560._M_allocated_capacity._1_7_,local_560._M_local_buf[0]) +
                        1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[local_578.soo_data[0]]._M_data)
                ((anon_class_1_0_00000001 *)&local_160,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_5a8 + 0x10));
      local_578.soo_data[0] = 0xff;
      if ((FileGenerator *)local_5b8._0_8_ != (FileGenerator *)local_5a8) {
        operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
      }
      if (local_7e8 != (FileGenerator *)local_7d8) {
        operator_delete(local_7e8,CONCAT71(local_7d8._1_7_,local_7d8[0]) + 1);
      }
    }
    if (local_118[0].
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118[0].
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118[0].
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118[0].
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  StripSourceRetentionOptions((compiler *)local_118,this->file_,false);
  local_808 = local_800._M_local_buf + 8;
  local_800._M_allocated_capacity = 0;
  local_800._M_local_buf[8] = '\0';
  google::protobuf::MessageLite::SerializeToString((string *)local_118);
  filename._M_str = (char *)local_940;
  filename._M_len = **(size_t **)(this->file_ + 8);
  name._M_str = (char *)(*(size_t **)(this->file_ + 8))[1];
  name._M_len = (size_t)"descriptor_table_protodef";
  UniqueName_abi_cxx11_((string *)local_668,(cpp *)0x19,name,filename,in_stack_fffffffffffff6a8);
  pOVar30 = local_948;
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"desc_name","");
  io::Printer::Sub::Sub<std::__cxx11::string&>
            ((Sub *)local_5b8,&local_6e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668);
  local_828 = &local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"encoded_file_proto","");
  local_500._0_8_ = local_500 + 0x10;
  if (local_828 == &local_818) {
    local_500._24_8_ = uStack_810;
  }
  else {
    local_500._0_8_ = local_828;
  }
  local_500._8_8_ = local_820;
  local_820 = (pointer)0x0;
  local_818 = (FileDescriptor)0x0;
  local_828 = &local_818;
  local_4e0._0_8_ = operator_new(0x20);
  *(FileGenerator **)local_4e0._0_8_ = this;
  *(Options ***)(local_4e0._0_8_ + 8) = &local_948;
  *(char ***)(local_4e0._0_8_ + 0x10) = &local_808;
  *(char *)(local_4e0._0_8_ + 0x18) = '\0';
  local_4c8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4e0._8_8_ = 0;
  local_4e0._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_4c0 = true;
  local_4b0 = 0;
  local_4a8._M_local_buf[0] = '\0';
  local_498 = false;
  local_4b8._M_p = (pointer)&local_4a8;
  std::__cxx11::string::_M_replace((ulong)&local_4b8,0,(char *)0x0,0x36a4ec);
  local_450 = false;
  google::protobuf::io::Printer::Emit
            (pOVar30,local_5b8,2,0x96,
             "\n        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n            protodesc_cold) = {\n            $encoded_file_proto$,\n        };\n      "
            );
  lVar23 = 0x170;
  do {
    if (acStack_5c0[lVar23] == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (auStack_600 + lVar23));
    }
    if (local_608 + lVar23 + -0x10 != *(anon_class_1_0_00000001 **)(local_628 + lVar23)) {
      operator_delete(*(anon_class_1_0_00000001 **)(local_628 + lVar23),
                      *(long *)(local_608 + lVar23 + -0x10) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_648.field_2._M_local_buf[lVar23 + 8]]._M_data)
              ((anon_class_1_0_00000001 *)&local_160,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_668 + lVar23 + 0x18));
    local_648.field_2._M_local_buf[lVar23 + 8] = -1;
    if ((long *)(local_668 + lVar23 + 8) != *(long **)(local_668 + lVar23 + -8)) {
      operator_delete(*(long **)(local_668 + lVar23 + -8),*(long *)(local_668 + lVar23 + 8) + 1);
    }
    lVar23 = lVar23 + -0xb8;
  } while (lVar23 != 0);
  if (local_828 != &local_818) {
    operator_delete(local_828,CONCAT71(uStack_817,local_818) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  local_160.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  local_160.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_160.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  local_160.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  local_160.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_160.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  local_160.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  local_160.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_160.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  GetCrossFileReferencesForFile(this,this->file_,&local_160);
  pOVar30 = local_948;
  local_8b0._M_p =
       (pointer)(local_160.weak_reflection_files.
                 super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                 .
                 super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                 .tree_.size_ +
                local_160.strong_reflection_files.
                super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                .
                super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                .tree_.size_);
  if (local_8b0._M_p != (pointer)0x0) {
    local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"len","");
    io::Printer::Sub::Sub<unsigned_long&>((Sub *)local_5b8,&local_708,(unsigned_long *)&local_8b0);
    local_848 = local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"deps","");
    local_500._0_8_ = local_500 + 0x10;
    if (local_848 == local_838) {
      local_500._24_8_ = uStack_830;
    }
    else {
      local_500._0_8_ = local_848;
    }
    local_500._8_8_ = local_840;
    local_840 = (pointer)0x0;
    local_838[0] = (FileDescriptor)0x0;
    local_848 = local_838;
    local_4e0._0_8_ = operator_new(0x20);
    *(CrossFileReferences **)local_4e0._0_8_ = &local_160;
    *(Options ***)(local_4e0._0_8_ + 8) = &local_948;
    *(FileGenerator **)(local_4e0._0_8_ + 0x10) = this;
    *(char *)(local_4e0._0_8_ + 0x18) = '\0';
    local_4c8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_4e0._8_8_ = 0;
    local_4e0._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_4c0 = true;
    local_4b0 = 0;
    local_4a8._M_local_buf[0] = '\0';
    local_498 = false;
    local_4b8._M_p = (pointer)&local_4a8;
    std::__cxx11::string::_M_replace((ulong)&local_4b8,0,(char *)0x0,0x36a4ec);
    local_450 = false;
    google::protobuf::io::Printer::Emit
              (pOVar30,local_5b8,2,0x91,
               "\n          static const ::_pbi::DescriptorTable* const $desc_table$_deps[$len$] =\n              {\n                  $deps$,\n          };\n        "
              );
    lVar23 = 0x170;
    do {
      if (acStack_5c0[lVar23] == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (auStack_600 + lVar23));
      }
      if (local_608 + lVar23 + -0x10 != *(anon_class_1_0_00000001 **)(local_628 + lVar23)) {
        operator_delete(*(anon_class_1_0_00000001 **)(local_628 + lVar23),
                        *(long *)(local_608 + lVar23 + -0x10) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)local_648.field_2._M_local_buf[lVar23 + 8]]._M_data)
                ((anon_class_1_0_00000001 *)local_5f8,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_668 + lVar23 + 0x18));
      local_648.field_2._M_local_buf[lVar23 + 8] = -1;
      if ((long *)(local_668 + lVar23 + 8) != *(long **)(local_668 + lVar23 + -8)) {
        operator_delete(*(long **)(local_668 + lVar23 + -8),*(long *)(local_668 + lVar23 + 8) + 1);
      }
      lVar23 = lVar23 + -0xb8;
    } while (lVar23 != 0);
    if (local_848 != local_838) {
      operator_delete(local_848,CONCAT71(local_838._1_7_,local_838[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_708._M_dataplus._M_p != &local_708.field_2) {
      operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
    }
  }
  pOVar30 = local_948;
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"eager","");
  local_938._M_dataplus._M_p = "false";
  io::Printer::Sub::Sub<char_const*>((Sub *)local_5b8,&local_688,(char **)&local_938);
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"file_proto_len","");
  local_888.heap.control = (ctrl_t *)local_800._M_allocated_capacity;
  if ((this->options_).strip_nonfunctional_codegen != false) {
    local_888.heap.control =
         (ctrl_t *)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
  }
  io::Printer::Sub::Sub<unsigned_long>
            ((Sub *)local_500,&local_728,(unsigned_long *)local_888.soo_data);
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"proto_name","");
  io::Printer::Sub::Sub<std::__cxx11::string&>
            (&local_448,&local_748,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668);
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"deps_ptr","");
  if (local_8b0._M_p == (pointer)0x0) {
    local_910._0_8_ = local_900;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"nullptr","");
  }
  else {
    local_5f8._0_16_ = google::protobuf::io::Printer::LookupVar(local_948,10,"desc_table");
    local_900._24_8_ = &DAT_00000005;
    pcStack_8e0 = (char *)((long)"num_deps" + 3);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_910,(AlphaNum *)local_5f8);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_390,&local_768,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_910);
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"num_deps","");
  io::Printer::Sub::Sub<unsigned_long&>(&local_2d8,&local_6a8,(unsigned_long *)&local_8b0);
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"num_msgs","");
  local_868._M_dataplus._M_p =
       (pointer)((long)(this->message_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->message_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
  io::Printer::Sub::Sub<unsigned_long>(&local_220,&local_6c8,(unsigned_long *)&local_868);
  google::protobuf::io::Printer::Emit
            (pOVar30,local_5b8,6,0x226,
             "\n        static ::absl::once_flag $desc_table$_once;\n        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {\n            false,\n            $eager$,\n            $file_proto_len$,\n            $proto_name$,\n            \"$filename$\",\n            &$desc_table$_once,\n            $deps_ptr$,\n            $num_deps$,\n            $num_msgs$,\n            schemas,\n            file_default_instances,\n            $tablename$::offsets,\n            $file_level_enum_descriptors$,\n            $file_level_service_descriptors$,\n        };\n      "
            );
  lVar23 = 0x450;
  do {
    if (acStack_5c0[lVar23] == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (auStack_600 + lVar23));
    }
    if (local_608 + lVar23 + -0x10 != *(anon_class_1_0_00000001 **)(local_628 + lVar23)) {
      operator_delete(*(anon_class_1_0_00000001 **)(local_628 + lVar23),
                      *(long *)(local_608 + lVar23 + -0x10) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_648.field_2._M_local_buf[lVar23 + 8]]._M_data)
              (local_608,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_668 + lVar23 + 0x18));
    local_648.field_2._M_local_buf[lVar23 + 8] = -1;
    if ((long *)(local_668 + lVar23 + 8) != *(long **)(local_668 + lVar23 + -8)) {
      operator_delete(*(long **)(local_668 + lVar23 + -8),*(long *)(local_668 + lVar23 + 8) + 1);
    }
    lVar23 = lVar23 + -0xb8;
  } while (lVar23 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  if ((Options *)local_910._0_8_ != (Options *)local_900) {
    operator_delete((void *)local_910._0_8_,(ulong)(local_900._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,local_768.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,local_748.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  cVar12 = google::protobuf::internal::cpp::IsLazilyInitializedFile
                     ((*(undefined8 **)(this->file_ + 8))[1],**(undefined8 **)(this->file_ + 8));
  if (cVar12 == '\0') {
    bVar11 = UsingImplicitWeakDescriptor(this->file_,local_940);
    if (bVar11) {
      pFVar24 = this->file_;
      local_910._0_8_ =
           absl::lts_20240722::container_internal::
           btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
           ::EmptyNode()::empty_node;
      local_910._8_8_ =
           absl::lts_20240722::container_internal::
           btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
           ::EmptyNode()::empty_node;
      local_900._0_8_ = (AccessInfoMap *)0x0;
      if (0 < *(int *)(pFVar24 + 0x44)) {
        iVar19 = 0;
        do {
          this_00 = FileDescriptor::service(pFVar24,iVar19);
          if (0 < *(int *)(this_00 + 0x38)) {
            iVar20 = 0;
            do {
              ServiceDescriptor::method(this_00,iVar20);
              pDVar14 = (mapped_type)google::protobuf::MethodDescriptor::input_type();
              lVar23 = google::protobuf::MethodDescriptor::input_type();
              ppDVar15 = absl::lts_20240722::container_internal::
                         btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                         ::operator[]<std::__cxx11::string>
                                   ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                     *)local_910,
                                    (key_arg<std::__cxx11::basic_string<char>_> *)
                                    (*(long *)(lVar23 + 8) + 0x20));
              *ppDVar15 = pDVar14;
              pDVar14 = (mapped_type)google::protobuf::MethodDescriptor::output_type();
              lVar23 = google::protobuf::MethodDescriptor::output_type();
              ppDVar15 = absl::lts_20240722::container_internal::
                         btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                         ::operator[]<std::__cxx11::string>
                                   ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                     *)local_910,
                                    (key_arg<std::__cxx11::basic_string<char>_> *)
                                    (*(long *)(lVar23 + 8) + 0x20));
              *ppDVar15 = pDVar14;
              iVar20 = iVar20 + 1;
            } while (iVar20 < *(int *)(this_00 + 0x38));
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 < *(int *)((FileDescriptorProto *)pFVar24 + 0x44));
      }
      pDVar6 = *(DescriptorPool **)((FileDescriptorProto *)pFVar24 + 0x18);
      lVar23 = google::protobuf::FileDescriptorProto::GetMetadata();
      lVar23 = google::protobuf::DescriptorPool::FindMessageTypeByName
                         (pDVar6,*(undefined8 *)(*(long *)(lVar23 + 8) + 0x28),
                          *(undefined8 *)(*(long *)(lVar23 + 8) + 0x20));
      if (lVar23 != 0) {
        google::protobuf::DynamicMessageFactory::DynamicMessageFactory
                  ((DynamicMessageFactory *)local_5f8,pDVar6);
        pAVar16 = (Arena *)google::protobuf::DynamicMessageFactory::GetPrototype
                                     ((Descriptor *)local_5f8);
        local_918 = (Message *)google::protobuf::MessageLite::New(pAVar16);
        google::protobuf::FileDescriptorProto::FileDescriptorProto
                  ((FileDescriptorProto *)local_5b8,(Arena *)0x0);
        google::protobuf::FileDescriptor::CopyTo((FileDescriptorProto *)pFVar24);
        google::protobuf::MessageLite::SerializeAsString_abi_cxx11_();
        cVar12 = google::protobuf::MessageLite::ParseFromString
                           (local_918,pcStack_8e0,local_900._24_8_);
        if (cVar12 == '\0') {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_608,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/cpp/file.cc"
                     ,0x42e,0x40,"fd_proto->ParseFromString(linkedin_fd_proto.SerializeAsString())")
          ;
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_608);
        }
        if ((Message *)local_900._24_8_ != local_8d8) {
          operator_delete((void *)local_900._24_8_,local_8d8._0_8_ + 1);
        }
        google::protobuf::FileDescriptorProto::~FileDescriptorProto
                  ((FileDescriptorProto *)local_5b8);
        local_900._24_8_ = local_918;
        __l._M_len = 1;
        __l._M_array = (iterator)(local_900 + 0x18);
        std::
        vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ::vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  *)local_5b8,__l,(allocator_type *)&local_888.heap);
        if (local_5b8._0_8_ != local_5b8._8_8_) {
          do {
            pvVar7 = (vector *)
                     (((FileGenerator *)(local_5b8._8_8_ + -0x308))->extension_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_5b8._8_8_ =
                 &(((FileGenerator *)(local_5b8._8_8_ + -0x308))->extension_generators_).
                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_900._24_8_ = (Message *)0x0;
            pcStack_8e0 = (char *)0x0;
            local_8d8[0] = (Message)0x0;
            local_8d8[1] = (Message)0x0;
            local_8d8[2] = (Message)0x0;
            local_8d8[3] = (Message)0x0;
            local_8d8[4] = (Message)0x0;
            local_8d8[5] = (Message)0x0;
            local_8d8[6] = (Message)0x0;
            local_8d8[7] = (Message)0x0;
            google::protobuf::Message::GetMetadata();
            google::protobuf::Reflection::ListFields(extraout_RDX,pvVar7);
            pMVar26 = (Message *)local_900._24_8_;
            pMVar29 = (Message *)pcStack_8e0;
            if ((char *)local_900._24_8_ != pcStack_8e0) {
              do {
                pMVar8 = *(MessageFactory **)pMVar26;
                if (((byte)pMVar8[1] & 8) != 0) {
                  pDVar14 = (mapped_type)google::protobuf::Message::GetMetadata();
                  ppDVar15 = absl::lts_20240722::container_internal::
                             btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                             ::operator[]<std::__cxx11::string>
                                       ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                         *)local_910,
                                        (key_arg<std::__cxx11::basic_string<char>_> *)
                                        (*(long *)(pDVar14 + 8) + 0x20));
                  *ppDVar15 = pDVar14;
                }
                pDVar14 = (mapped_type)google::protobuf::FieldDescriptor::message_type();
                if (pDVar14 != (mapped_type)0x0) {
                  if (((byte)pMVar8[1] & 8) != 0) {
                    ppDVar15 = absl::lts_20240722::container_internal::
                               btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                               ::operator[]<std::__cxx11::string>
                                         ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                           *)local_910,
                                          (key_arg<std::__cxx11::basic_string<char>_> *)
                                          (*(long *)(pDVar14 + 8) + 0x20));
                    *ppDVar15 = pDVar14;
                  }
                  MVar3 = pMVar8[1];
                  bVar11 = (bool)(((byte)MVar3 & 0x20) >> 5);
                  if (0xbf < (byte)MVar3 == bVar11) {
                    psVar17 = (string *)0x0;
                  }
                  else {
                    psVar17 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                        (bVar11,0xbf < (byte)MVar3,
                                         "is_repeated_ == label() == LABEL_REPEATED");
                  }
                  if (psVar17 != (string *)0x0) {
                    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                              ((LogMessageFatal *)&local_888,
                               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                               ,0xab7,*(undefined8 *)(psVar17 + 8),*(undefined8 *)psVar17);
                    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                              ((LogMessageFatal *)&local_888.heap);
                  }
                  if (((byte)pMVar8[1] & 0x20) == 0) {
                    local_888.heap.control =
                         (ctrl_t *)
                         google::protobuf::Reflection::GetMessage
                                   (extraout_RDX,(FieldDescriptor *)pvVar7,pMVar8);
                    std::
                    vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                    ::emplace_back<google::protobuf::Message_const*>
                              ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                                *)local_5b8,(Message **)&local_888);
                  }
                  else {
                    iVar19 = 0;
                    while( true ) {
                      iVar20 = google::protobuf::Reflection::FieldSize
                                         (extraout_RDX,(FieldDescriptor *)pvVar7);
                      if (iVar20 <= iVar19) break;
                      local_888.heap.control =
                           (ctrl_t *)
                           google::protobuf::Reflection::GetRepeatedMessage
                                     (extraout_RDX,(FieldDescriptor *)pvVar7,(int)pMVar8);
                      std::
                      vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                      ::emplace_back<google::protobuf::Message_const*>
                                ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                                  *)local_5b8,(Message **)&local_888);
                      iVar19 = iVar19 + 1;
                    }
                  }
                }
                pMVar26 = pMVar26 + 8;
              } while (pMVar26 != pMVar29);
            }
            if ((Message *)local_900._24_8_ != (Message *)0x0) {
              operator_delete((void *)local_900._24_8_,local_8d8._0_8_ - local_900._24_8_);
            }
          } while (local_5b8._0_8_ != local_5b8._8_8_);
        }
        if ((FileGenerator *)local_5b8._0_8_ != (FileGenerator *)0x0) {
          operator_delete((void *)local_5b8._0_8_,local_5a8._0_8_ - local_5b8._0_8_);
        }
        (**(code **)(*(long *)local_918 + 8))();
        google::protobuf::DynamicMessageFactory::~DynamicMessageFactory
                  ((DynamicMessageFactory *)local_5f8);
      }
      local_938._M_dataplus._M_p = (pointer)0x0;
      local_938._M_string_length = 0;
      local_938.field_2._M_allocated_capacity = 0;
      iVar28 = absl::lts_20240722::container_internal::
               btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
               ::begin((btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                        *)local_910);
      uVar10 = local_910._8_8_;
      local_5b8._0_8_ = iVar28.node_;
      local_5b8._8_4_ = iVar28.position_;
      if ((local_910._8_8_ & 7) != 0) {
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                      ,0x1fe,
                      "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string_view<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string_view<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsi..." /* TRUNCATED STRING LITERAL */
                     );
      }
      bVar4 = *(btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                *)(local_910._8_8_ + 10);
      while( true ) {
        other.position_._0_1_ = bVar4;
        other.node_ = (btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                       *)uVar10;
        other._9_7_ = 0;
        bVar11 = absl::lts_20240722::container_internal::
                 btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                 ::Equals((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                           *)local_5b8,other);
        if (bVar11) break;
        ppVar18 = absl::lts_20240722::container_internal::
                  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                  ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                               *)local_5b8);
        bVar11 = IsBootstrapProto(local_940,*(FileDescriptor **)(ppVar18->second + 0x10));
        if (!bVar11) {
          if (local_938._M_string_length == local_938.field_2._M_allocated_capacity) {
            std::
            vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
            ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                      ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                        *)&local_938,(iterator)local_938._M_string_length,&ppVar18->second);
          }
          else {
            *(Descriptor **)local_938._M_string_length = ppVar18->second;
            local_938._M_string_length = local_938._M_string_length + 8;
          }
        }
        absl::lts_20240722::container_internal::
        btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
        ::increment((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                     *)local_5b8);
      }
      absl::lts_20240722::container_internal::
      btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
      ::~btree((btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                *)local_910);
      sVar9 = local_938._M_string_length;
      if (local_938._M_dataplus._M_p != (pointer)local_938._M_string_length) {
        _Var27._M_p = local_938._M_dataplus._M_p;
        do {
          local_5b8._8_8_ = *(undefined8 *)_Var27._M_p;
          local_5a8._8_8_ =
               absl::lts_20240722::internal_any_invocable::
               LocalInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__0&,google::protobuf::io::Printer*>
          ;
          local_5a8._0_8_ = absl::lts_20240722::internal_any_invocable::LocalManagerTrivial;
          local_5b8._0_8_ = this;
          std::
          vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
          ::emplace_back<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>
                    ((vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
                      *)(this->static_initializers_ + 1),
                     (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)local_5b8);
          (*(code *)local_5a8._0_8_)
                    (1,(AnyInvocable<void_(google::protobuf::io::Printer_*)> *)local_5b8,
                     (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)local_5b8);
          _Var27._M_p = _Var27._M_p + 8;
        } while (_Var27._M_p != (pointer)sVar9);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_938._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_938._M_dataplus._M_p,
                        local_938.field_2._M_allocated_capacity - (long)local_938._M_dataplus._M_p);
      }
    }
    local_5a8._8_8_ =
         absl::lts_20240722::internal_any_invocable::
         LocalInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__1&,google::protobuf::io::Printer*>
    ;
    local_5a8._0_8_ = absl::lts_20240722::internal_any_invocable::LocalManagerTrivial;
    std::
    vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
    ::emplace_back<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>
              ((vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
                *)(this->static_initializers_ + 1),
               (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)local_5b8);
    (*(code *)local_5a8._0_8_)(1,local_5b8);
  }
  bVar11 = IsFileDescriptorProto(this->file_,local_940);
  if (bVar11) {
    local_910._0_8_ = local_948;
    local_900._0_8_ = (AccessInfoMap *)0x0;
    local_900._8_8_ = (SplitMap *)0x0;
    local_900._16_8_ = (pointer)0x0;
    bVar11 = (this->options_).opensource_runtime != false;
    local_5b8._0_8_ = (FileGenerator *)0x6;
    if (bVar11) {
      local_5b8._0_8_ = (FileGenerator *)0x10;
    }
    local_5b8._8_8_ = "proto2";
    if (bVar11) {
      local_5b8._8_8_ = "google::protobuf";
    }
    local_5f8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0xa;
    local_5f8._8_8_ = "::internal";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)(local_900 + 0x18),(AlphaNum *)local_5b8);
    NamespaceOpener::ChangeTo((NamespaceOpener *)local_910,pcStack_8e0,local_900._24_8_);
    if ((Message *)local_900._24_8_ != local_8d8) {
      operator_delete((void *)local_900._24_8_,local_8d8._0_8_ + 1);
    }
    local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
    pOVar30 = local_948;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"dummy","");
    sVar22 = **(size_t **)(this->file_ + 8);
    filename_00._M_str = (char *)local_940;
    filename_00._M_len = sVar22;
    name_00._M_str = (char *)(*(size_t **)(this->file_ + 8))[1];
    name_00._M_len = (size_t)"dynamic_init_dummy";
    UniqueName_abi_cxx11_((string *)&local_888.heap,(cpp *)0x12,name_00,filename_00,pOVar30);
    io::Printer::Sub::Sub<std::__cxx11::string>
              ((Sub *)local_5b8,&local_788,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_888.heap)
    ;
    local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_7d8 + 0x30),"initializers","");
    puVar25 = (this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
    local_868._M_string_length = 0;
    local_868.field_2._M_local_buf[0] = '\0';
    if (puVar25 != puVar5) {
      pcVar21 = "";
      do {
        std::__cxx11::string::append((char *)&local_868,(ulong)pcVar21);
        DefaultInstanceName_abi_cxx11_
                  (&local_938,
                   (cpp *)((puVar25->_M_t).
                           super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                           .
                           super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                          ._M_head_impl)->descriptor_,(Descriptor *)local_940,(Options *)0x0,
                   SUB81(sVar22,0));
        local_5f8._0_8_ = local_938._M_string_length;
        local_5f8._8_8_ = local_938._M_dataplus._M_p;
        local_900._24_8_ = &DAT_00000008;
        pcStack_8e0 = ".Init();";
        absl::lts_20240722::StrAppend
                  ((string *)&local_868,(AlphaNum *)local_5f8,(AlphaNum *)(local_900 + 0x18));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_938._M_dataplus._M_p != &local_938.field_2) {
          operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
        }
        puVar25 = puVar25 + 1;
        pcVar21 = "\n";
      } while (puVar25 != puVar5);
    }
    io::Printer::Sub::Sub<std::__cxx11::string>
              ((Sub *)local_500,(string *)(local_7d8 + 0x30),&local_868);
    google::protobuf::io::Printer::Emit
              (pOVar30,local_5b8,2,0x1dc,
               "\n          //~ Emit wants an indented line, so give it a comment to strip.\n#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {\n            $initializers$;\n          }\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\n          static std::true_type $dummy${\n              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};\n#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n        "
              );
    lVar23 = 0x170;
    do {
      if (acStack_5c0[lVar23] == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (auStack_600 + lVar23));
      }
      if (local_608 + lVar23 + -0x10 != *(anon_class_1_0_00000001 **)(local_628 + lVar23)) {
        operator_delete(*(anon_class_1_0_00000001 **)(local_628 + lVar23),
                        *(long *)(local_608 + lVar23 + -0x10) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)local_648.field_2._M_local_buf[lVar23 + 8]]._M_data)
                ((anon_class_1_0_00000001 *)local_5f8,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_668 + lVar23 + 0x18));
      local_648.field_2._M_local_buf[lVar23 + 8] = -1;
      if ((long *)(local_668 + lVar23 + 8) != *(long **)(local_668 + lVar23 + -8)) {
        operator_delete(*(long **)(local_668 + lVar23 + -8),*(long *)(local_668 + lVar23 + 8) + 1);
      }
      lVar23 = lVar23 + -0xb8;
    } while (lVar23 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_868._M_dataplus._M_p != &local_868.field_2) {
      operator_delete(local_868._M_dataplus._M_p,
                      CONCAT71(local_868.field_2._M_allocated_capacity._1_7_,
                               local_868.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
      operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_888.heap.control != &local_878) {
      operator_delete(local_888.heap.control,local_878._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_dataplus._M_p != &local_788.field_2) {
      operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
    }
    NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_910);
  }
  absl::lts_20240722::container_internal::
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  ::~btree((btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
            *)&local_160.weak_reflection_files);
  absl::lts_20240722::container_internal::
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  ::~btree((btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
            *)&local_160.strong_reflection_files);
  absl::lts_20240722::container_internal::
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  ::~btree((btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
            *)&local_160);
  if ((undefined1 *)local_668._0_8_ != local_668 + 0x10) {
    operator_delete((void *)local_668._0_8_,local_668._16_8_ + 1);
  }
  if (local_808 != local_800._M_local_buf + 8) {
    operator_delete(local_808,CONCAT71(local_800._9_7_,local_800._M_local_buf[8]) + 1);
  }
  google::protobuf::FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_118);
  return;
}

Assistant:

void FileGenerator::GenerateReflectionInitializationCode(io::Printer* p) {
  if (!enum_generators_.empty()) {
    p->Emit({{"len", enum_generators_.size()}}, R"cc(
      static const ::_pb::EnumDescriptor* $file_level_enum_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::EnumDescriptor**
          $file_level_enum_descriptors$ = nullptr;
    )cc");
  }

  if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
    p->Emit({{"len", file_->service_count()}}, R"cc(
      static const ::_pb::ServiceDescriptor*
          $file_level_service_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::ServiceDescriptor**
          $file_level_service_descriptors$ = nullptr;
    )cc");
  }

  if (!message_generators_.empty()) {
    std::vector<std::pair<size_t, size_t>> offsets;
    offsets.reserve(message_generators_.size());

    p->Emit(
        {
            {"offsets",
             [&] {
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 offsets.push_back(message_generators_[i]->GenerateOffsets(p));
               }
             }},
            {"schemas",
             [&] {
               int offset = 0;
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 message_generators_[i]->GenerateSchema(p, offset,
                                                        offsets[i].second);
                 offset += offsets[i].first;
               }
             }},
        },
        R"cc(
          const ::uint32_t
              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
                  protodesc_cold) = {
                  $offsets$,
          };

          static const ::_pbi::MigrationSchema
              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {
                  $schemas$,
          };
        )cc");
    if (!UsingImplicitWeakDescriptor(file_, options_)) {
      p->Emit({{"defaults",
                [&] {
                  for (auto& gen : message_generators_) {
                    p->Emit(
                        {
                            {"ns", Namespace(gen->descriptor(), options_)},
                            {"class", ClassName(gen->descriptor())},
                        },
                        R"cc(
                          &$ns$::_$class$_default_instance_._instance,
                        )cc");
                  }
                }}},
              R"cc(
                static const ::_pb::Message* const file_default_instances[] = {
                    $defaults$,
                };
              )cc");
    }
  } else {
    // Ee still need these symbols to exist.
    //
    // MSVC doesn't like empty arrays, so we add a dummy.
    p->Emit(R"cc(
      const ::uint32_t $tablename$::offsets[1] = {};
      static constexpr ::_pbi::MigrationSchema* schemas = nullptr;
      static constexpr ::_pb::Message* const* file_default_instances = nullptr;
    )cc");
  }

  // ---------------------------------------------------------------

  // Embed the descriptor.  We simply serialize the entire
  // FileDescriptorProto/ and embed it as a string literal, which is parsed and
  // built into real descriptors at initialization time.

  FileDescriptorProto file_proto = StripSourceRetentionOptions(*file_);
  std::string file_data;
  file_proto.SerializeToString(&file_data);

  auto desc_name = UniqueName("descriptor_table_protodef", file_, options_);
  p->Emit(
      {{"desc_name", desc_name},
       {"encoded_file_proto",
        [&] {
          if (options_.strip_nonfunctional_codegen) {
            p->Emit(R"cc("")cc");
            return;
          }

          absl::string_view data = file_data;
          if (data.size() <= 65535) {
            static constexpr size_t kBytesPerLine = 40;
            while (!data.empty()) {
              auto to_write = std::min(kBytesPerLine, data.size());
              auto chunk = data.substr(0, to_write);
              data = data.substr(to_write);

              p->Emit({{"text", EscapeTrigraphs(absl::CEscape(chunk))}}, R"cc(
                "$text$"
              )cc");
            }
            return;
          }

          // Workaround for MSVC: "Error C1091: compiler limit: string exceeds
          // 65535 bytes in length". Declare a static array of chars rather than
          // use a string literal. Only write 25 bytes per line.
          static constexpr size_t kBytesPerLine = 25;
          while (!data.empty()) {
            auto to_write = std::min(kBytesPerLine, data.size());
            auto chunk = data.substr(0, to_write);
            data = data.substr(to_write);

            std::string line;
            for (char c : chunk) {
              absl::StrAppend(&line, "'",
                              absl::CEscape(absl::string_view(&c, 1)), "', ");
            }

            p->Emit({{"line", line}}, R"cc(
              $line$
            )cc");
          }
        }}},
      R"cc(
        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
            protodesc_cold) = {
            $encoded_file_proto$,
        };
      )cc");

  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  size_t num_deps =
      refs.strong_reflection_files.size() + refs.weak_reflection_files.size();

  // Build array of DescriptorTable deps.
  if (num_deps > 0) {
    p->Emit(
        {
            {"len", num_deps},
            {"deps",
             [&] {
               for (auto dep : refs.strong_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
               for (auto dep : refs.weak_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
             }},
        },
        R"cc(
          static const ::_pbi::DescriptorTable* const $desc_table$_deps[$len$] =
              {
                  $deps$,
          };
        )cc");
  }

  // The DescriptorTable itself.
  // Should be "bool eager = NeedsEagerDescriptorAssignment(file_, options_);"
  // however this might cause a tsan failure in superroot b/148382879,
  // so disable for now.
  bool eager = false;
  p->Emit(
      {
          {"eager", eager ? "true" : "false"},
          {"file_proto_len",
           options_.strip_nonfunctional_codegen ? 0 : file_data.size()},
          {"proto_name", desc_name},
          {"deps_ptr", num_deps == 0
                           ? "nullptr"
                           : absl::StrCat(p->LookupVar("desc_table"), "_deps")},
          {"num_deps", num_deps},
          {"num_msgs", message_generators_.size()},
      },
      R"cc(
        static ::absl::once_flag $desc_table$_once;
        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {
            false,
            $eager$,
            $file_proto_len$,
            $proto_name$,
            "$filename$",
            &$desc_table$_once,
            $deps_ptr$,
            $num_deps$,
            $num_msgs$,
            schemas,
            file_default_instances,
            $tablename$::offsets,
            $file_level_enum_descriptors$,
            $file_level_service_descriptors$,
        };
      )cc");

  // For descriptor.proto and cpp_features.proto we want to avoid doing any
  // dynamic initialization, because in some situations that would otherwise
  // pull in a lot of unnecessary code that can't be stripped by --gc-sections.
  // Descriptor initialization will still be performed lazily when it's needed.
  if (!IsLazilyInitializedFile(file_->name())) {
    if (UsingImplicitWeakDescriptor(file_, options_)) {
      for (auto* pinned :
           GetMessagesToPinGloballyForWeakDescriptors(file_, options_)) {
        static_initializers_[kInitPriority102].push_back([this,
                                                          pinned](auto* p) {
          p->Emit({{"pin", StrongReferenceToType(pinned, options_)}},
                  R"cc(
                    $pin$,
                  )cc");
        });
      }
    }
    static_initializers_[kInitPriority102].push_back([](auto* p) {
      p->Emit(R"cc(
        ::_pbi::AddDescriptors(&$desc_table$),
      )cc");
    });
  }

  // However, we must provide a way to force initialize the default instances
  // of FileDescriptorProto which will be used during registration of other
  // files.
  if (IsFileDescriptorProto(file_, options_)) {
    NamespaceOpener ns(p);
    ns.ChangeTo(absl::StrCat(ProtobufNamespace(options_), "::internal"));
    p->Emit(
        {{"dummy", UniqueName("dynamic_init_dummy", file_, options_)},
         {"initializers", absl::StrJoin(message_generators_, "\n",
                                        [&](std::string* out, const auto& gen) {
                                          absl::StrAppend(
                                              out,
                                              DefaultInstanceName(
                                                  gen->descriptor(), options_),
                                              ".Init();");
                                        })}},
        R"cc(
          //~ Emit wants an indented line, so give it a comment to strip.
#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {
            $initializers$;
          }
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1
          static std::true_type $dummy${
              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};
#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
        )cc");
  }
}